

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O1

void __thiscall libtorrent::aux::directory::next(directory *this,error_code *ec)

{
  char *pcVar1;
  int *piVar2;
  dirent64 *pdVar3;
  
  ec->val_ = 0;
  ec->failed_ = false;
  ec->cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category
  ;
  piVar2 = __errno_location();
  *piVar2 = 0;
  pdVar3 = readdir64((DIR *)this->m_handle);
  if (pdVar3 != (dirent64 *)0x0) {
    pcVar1 = (char *)(this->m_name)._M_string_length;
    strlen(pdVar3->d_name);
    ::std::__cxx11::string::_M_replace((ulong)&this->m_name,0,pcVar1,(ulong)pdVar3->d_name);
    return;
  }
  if (*piVar2 != 0) {
    ec->val_ = *piVar2;
    ec->failed_ = true;
    ec->cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                super_error_category;
  }
  this->m_done = true;
  return;
}

Assistant:

void directory::next(error_code& ec)
	{
		ec.clear();
#ifdef TORRENT_WINDOWS
		if (FindNextFileW(m_handle, &m_fd) == 0)
		{
			m_done = true;
			int err = GetLastError();
			if (err != ERROR_NO_MORE_FILES)
				ec.assign(err, system_category());
		}
#else
		struct dirent* de;
		errno = 0;
		if ((de = ::readdir(m_handle)) != nullptr)
		{
			m_name = de->d_name;
		}
		else
		{
			if (errno) ec.assign(errno, system_category());
			m_done = true;
		}
#endif
	}